

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[9])();
  bVar3 = SUB41((info->resultDisposition & FalseTest) >> 2,0);
  if (bVar3 == expr->m_result) {
    reportExpr(this,info,ExpressionFailed,expr,bVar3);
    iVar2 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[6])();
    reaction->shouldDebugBreak = SUB41(iVar2,0);
    uVar1 = (this->m_totals).assertions.failed;
    iVar2 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
    bVar3 = true;
    if (uVar1 < (ulong)(long)iVar2) {
      bVar3 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
    }
    reaction->shouldThrow = bVar3;
    return;
  }
  if (this->m_includeSuccessfulResults != false) {
    reportExpr(this,info,Ok,expr,bVar3);
    return;
  }
  (*(this->super_IResultCapture)._vptr_IResultCapture[0x11])(this);
  return;
}

Assistant:

void RunContext::handleExpr(AssertionInfo const &info, ITransientExpression const &expr, AssertionReaction &reaction) {
    m_reporter->assertionStarting(info);

    bool negated = isFalseTest(info.resultDisposition);
    bool result = expr.getResult() != negated;

    if (result) {
      if (!m_includeSuccessfulResults) {
        assertionPassed();
      } else {
        reportExpr(info, ResultWas::Ok, &expr, negated);
      }
    } else {
      reportExpr(info, ResultWas::ExpressionFailed, &expr, negated);
      populateReaction(reaction);
    }
  }